

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::SliderBehaviorT<int,int,float>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,int *v,int v_min,int v_max,
               char *format,float power,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int *in_RCX;
  int in_EDX;
  ImGuiID in_ESI;
  ImVec2 *in_RDI;
  int in_R8D;
  int in_R9D;
  bool bVar6;
  bool bVar7;
  float in_XMM0_Da;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  ImVec2 IVar14;
  uint in_stack_00000010;
  undefined8 *in_stack_00000018;
  float grab_pos;
  float grab_t;
  int v_new_off_round;
  int v_new_off_floor;
  float v_new_off_f;
  float a_1;
  float a;
  int v_new;
  int decimal_precision;
  float delta;
  ImVec2 delta2;
  float mouse_abs_pos;
  float clicked_t;
  bool set_new_value;
  bool value_changed;
  float linear_dist_max_to_0;
  float linear_dist_min_to_0;
  float linear_zero_pos;
  float slider_usable_pos_max;
  float slider_usable_pos_min;
  float slider_usable_sz;
  int v_range;
  float grab_sz;
  float slider_sz;
  float grab_padding;
  bool is_power;
  bool is_decimal;
  ImGuiAxis axis;
  ImGuiStyle *style;
  ImGuiContext *g;
  int local_e4;
  float in_stack_ffffffffffffff20;
  float in_stack_ffffffffffffff24;
  float in_stack_ffffffffffffff28;
  float in_stack_ffffffffffffff2c;
  int iVar15;
  bool local_c5;
  float in_stack_ffffffffffffff3c;
  float in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  float in_stack_ffffffffffffff50;
  float in_stack_ffffffffffffff54;
  ImGuiInputReadMode in_stack_ffffffffffffff58;
  ImGuiNavDirSourceFlags in_stack_ffffffffffffff5c;
  float local_a0;
  float in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  int in_stack_ffffffffffffff7c;
  float local_80;
  float local_7c;
  float fStack_78;
  float local_70;
  bool local_69;
  float local_60;
  float local_4c;
  
  pIVar1 = GImGui;
  uVar3 = (uint)((in_stack_00000010 & 1) != 0);
  bVar6 = in_EDX == 4;
  bVar7 = in_EDX == 5;
  local_c5 = bVar6 || bVar7;
  if ((in_XMM0_Da == 1.0) && (!NAN(in_XMM0_Da))) {
    local_c5 = false;
  }
  fVar8 = ImVec2::operator[](in_RDI + 1,(long)(int)uVar3);
  fVar9 = ImVec2::operator[](in_RDI,(long)(int)uVar3);
  fVar9 = (fVar8 - fVar9) - 4.0;
  local_4c = (pIVar1->Style).GrabMinSize;
  if (in_R8D < in_R9D) {
    iVar4 = in_R9D - in_R8D;
  }
  else {
    iVar4 = in_R8D - in_R9D;
  }
  local_7c = in_stack_ffffffffffffff20;
  iVar15 = iVar4;
  local_e4 = in_stack_ffffffffffffff7c;
  if ((!bVar6 && !bVar7) && (-1 < iVar4)) {
    local_4c = ImMax<float>(fVar9 / (float)(iVar4 + 1),(pIVar1->Style).GrabMinSize);
    local_7c = in_stack_ffffffffffffff20;
    local_e4 = in_stack_ffffffffffffff7c;
  }
  fVar10 = ImMin<float>(local_4c,fVar9);
  fVar11 = ImVec2::operator[](in_RDI,(long)(int)uVar3);
  fVar11 = fVar10 * 0.5 + fVar11 + 2.0;
  fVar12 = ImVec2::operator[](in_RDI + 1,(long)(int)uVar3);
  if ((!local_c5) || (0.0 <= (float)(in_R8D * in_R9D))) {
    local_60 = (float)(-(uint)((float)in_R8D < 0.0) & 0x3f800000);
  }
  else {
    if (in_R8D < 0) {
      in_stack_ffffffffffffff2c = -(float)in_R8D;
    }
    else {
      in_stack_ffffffffffffff2c = (float)in_R8D;
    }
    local_60 = ImPow(0.0,2.376601e-39);
    if (in_R9D < 0) {
      in_stack_ffffffffffffff28 = -(float)in_R9D;
    }
    else {
      in_stack_ffffffffffffff28 = (float)in_R9D;
    }
    fVar13 = ImPow(0.0,2.37673e-39);
    local_60 = local_60 / (local_60 + fVar13);
  }
  local_69 = false;
  if (pIVar1->ActiveId == in_ESI) {
    bVar2 = false;
    local_70 = 0.0;
    if (pIVar1->ActiveIdSource == ImGuiInputSource_Mouse) {
      if (((pIVar1->IO).MouseDown[0] & 1U) == 0) {
        ClearActiveID();
      }
      else {
        fVar13 = ImVec2::operator[](&(pIVar1->IO).MousePos,(long)(int)uVar3);
        if (fVar9 - fVar10 <= 0.0) {
          in_stack_ffffffffffffff24 = 0.0;
        }
        else {
          in_stack_ffffffffffffff24 = ImClamp<float>((fVar13 - fVar11) / (fVar9 - fVar10),0.0,1.0);
        }
        local_70 = in_stack_ffffffffffffff24;
        if (uVar3 == 1) {
          local_70 = 1.0 - in_stack_ffffffffffffff24;
        }
        bVar2 = true;
      }
    }
    else if (pIVar1->ActiveIdSource == ImGuiInputSource_Nav) {
      IVar14 = GetNavInputAmount2d(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,
                                   in_stack_ffffffffffffff54,in_stack_ffffffffffffff50);
      if (uVar3 == 0) {
        local_7c = IVar14.x;
      }
      else {
        fStack_78 = IVar14.y;
        local_7c = -fStack_78;
      }
      if ((pIVar1->NavActivatePressedId == in_ESI) && ((pIVar1->ActiveIdIsJustActivated & 1U) == 0))
      {
        ClearActiveID();
      }
      else if ((local_7c != 0.0) || (NAN(local_7c))) {
        fVar9 = local_7c;
        local_70 = SliderCalcRatioFromValueT<int,float>
                             ((ImGuiDataType)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                              in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
                              in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
        if (bVar6 || bVar7) {
          local_e4 = ImParseFormatPrecision
                               ((char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28
                                                ),(int)in_stack_ffffffffffffff24);
        }
        else {
          local_e4 = 0;
        }
        if ((0 < local_e4) || (local_c5)) {
          local_80 = local_7c / 100.0;
          bVar2 = IsNavInputDown(0xe);
          if (bVar2) {
            local_80 = local_80 / 10.0;
          }
        }
        else if (((-100.0 <= (float)iVar4) && ((float)iVar4 <= 100.0)) ||
                (bVar2 = IsNavInputDown(0xe), bVar2)) {
          local_80 = (float)(~-(uint)(local_7c < 0.0) & 0x3f800000 |
                            -(uint)(local_7c < 0.0) & 0xbf800000) / (float)iVar4;
        }
        else {
          local_80 = local_7c / 100.0;
        }
        bVar2 = IsNavInputDown(0xf);
        if (bVar2) {
          local_80 = local_80 * 10.0;
        }
        bVar2 = true;
        if (((1.0 <= local_70) && (0.0 < local_80)) || ((local_70 <= 0.0 && (local_80 < 0.0)))) {
          bVar2 = false;
          local_7c = fVar9;
        }
        else {
          local_70 = ImSaturate(local_70 + local_80);
          local_7c = fVar9;
        }
      }
    }
    if (bVar2) {
      if (local_c5) {
        if (local_60 <= local_70) {
          ImFabs(local_60 - 1.0);
          in_stack_ffffffffffffff70 = ImPow(0.0,2.378518e-39);
          iVar4 = ImMax<int>(in_R8D,0);
          iVar4 = ImLerp<int>(iVar4,in_R9D,in_stack_ffffffffffffff70);
        }
        else {
          in_stack_ffffffffffffff74 = ImPow(0.0,2.378288e-39);
          iVar4 = ImMin<int>(in_R9D,0);
          iVar4 = ImLerp<int>(iVar4,in_R8D,in_stack_ffffffffffffff74);
        }
      }
      else if (bVar6 || bVar7) {
        iVar4 = ImLerp<int>(in_R8D,in_R9D,local_70);
      }
      else {
        local_70 = (float)(in_R9D - in_R8D) * local_70;
        iVar4 = (int)local_70;
        iVar5 = (int)(local_70 + 0.5);
        if ((!bVar6 && !bVar7) && (iVar4 < iVar5)) {
          iVar4 = iVar5;
        }
        iVar4 = in_R8D + iVar4;
      }
      iVar4 = RoundScalarWithFormatT<int,int>
                        ((char *)CONCAT44(local_e4,iVar4),(ImGuiDataType)in_stack_ffffffffffffff74,
                         (int)in_stack_ffffffffffffff70);
      local_69 = *in_RCX != iVar4;
      if (local_69) {
        *in_RCX = iVar4;
      }
    }
  }
  local_a0 = SliderCalcRatioFromValueT<int,float>
                       ((ImGuiDataType)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                        in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
                        in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  if (uVar3 == 1) {
    local_a0 = 1.0 - local_a0;
  }
  ImLerp<float>(fVar11,-fVar10 * 0.5 + (fVar12 - 2.0),local_a0);
  if (uVar3 == 0) {
    ImRect::ImRect((ImRect *)CONCAT44(fVar8,iVar15),in_stack_ffffffffffffff2c,
                   in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,local_7c);
    *in_stack_00000018 = CONCAT44(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    in_stack_00000018[1] = CONCAT44(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54);
  }
  else {
    ImRect::ImRect((ImRect *)CONCAT44(fVar8,iVar15),in_stack_ffffffffffffff2c,
                   in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,local_7c);
    *in_stack_00000018 = CONCAT44(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    in_stack_00000018[1] = CONCAT44(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44);
  }
  return local_69;
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, float power, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_power = (power != 1.0f) && is_decimal;

    const float grab_padding = 2.0f;
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);
    if (!is_decimal && v_range >= 0)                                             // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize);  // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz*0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz*0.5f;

    // For power curve sliders that cross over sign boundary we want the curve to be symmetric around 0.0f
    float linear_zero_pos;   // 0.0->1.0f
    if (is_power && v_min * v_max < 0.0f)
    {
        // Different sign
        const FLOATTYPE linear_dist_min_to_0 = ImPow(v_min >= 0 ? (FLOATTYPE)v_min : -(FLOATTYPE)v_min, (FLOATTYPE)1.0f/power);
        const FLOATTYPE linear_dist_max_to_0 = ImPow(v_max >= 0 ? (FLOATTYPE)v_max : -(FLOATTYPE)v_max, (FLOATTYPE)1.0f/power);
        linear_zero_pos = (float)(linear_dist_min_to_0 / (linear_dist_min_to_0 + linear_dist_max_to_0));
    }
    else
    {
        // Same sign
        linear_zero_pos = v_min < 0.0f ? 1.0f : 0.0f;
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            const ImVec2 delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 0.0f, 0.0f);
            float delta = (axis == ImGuiAxis_X) ? delta2.x : -delta2.y;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (delta != 0.0f)
            {
                clicked_t = SliderCalcRatioFromValueT<TYPE,FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
                const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
                if ((decimal_precision > 0) || is_power)
                {
                    delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta = ((delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    delta *= 10.0f;
                set_new_value = true;
                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                    set_new_value = false;
                else
                    clicked_t = ImSaturate(clicked_t + delta);
            }
        }

        if (set_new_value)
        {
            TYPE v_new;
            if (is_power)
            {
                // Account for power curve scale on both sides of the zero
                if (clicked_t < linear_zero_pos)
                {
                    // Negative: rescale to the negative range before powering
                    float a = 1.0f - (clicked_t / linear_zero_pos);
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMin(v_max, (TYPE)0), v_min, a);
                }
                else
                {
                    // Positive: rescale to the positive range before powering
                    float a;
                    if (ImFabs(linear_zero_pos - 1.0f) > 1.e-6f)
                        a = (clicked_t - linear_zero_pos) / (1.0f - linear_zero_pos);
                    else
                        a = clicked_t;
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMax(v_min, (TYPE)0), v_max, a);
                }
            }
            else
            {
                // Linear slider
                if (is_decimal)
                {
                    v_new = ImLerp(v_min, v_max, clicked_t);
                }
                else
                {
                    // For integer values we want the clicking position to match the grab box so we round above
                    // This code is carefully tuned to work with large values (e.g. high ranges of U64) while preserving this property..
                    FLOATTYPE v_new_off_f = (v_max - v_min) * clicked_t;
                    TYPE v_new_off_floor = (TYPE)(v_new_off_f);
                    TYPE v_new_off_round = (TYPE)(v_new_off_f + (FLOATTYPE)0.5);
                    if (!is_decimal && v_new_off_floor < v_new_off_round)
                        v_new = v_min + v_new_off_round;
                    else
                        v_new = v_min + v_new_off_floor;
                }
            }

            // Round to user desired precision based on format string
            v_new = RoundScalarWithFormatT<TYPE,SIGNEDTYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    // Output grab position so it can be displayed by the caller
    float grab_t = SliderCalcRatioFromValueT<TYPE,FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
    if (axis == ImGuiAxis_Y)
        grab_t = 1.0f - grab_t;
    const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
    if (axis == ImGuiAxis_X)
        *out_grab_bb = ImRect(grab_pos - grab_sz*0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz*0.5f, bb.Max.y - grab_padding);
    else
        *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz*0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz*0.5f);

    return value_changed;
}